

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

ssize_t __thiscall TextField::read(TextField *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  ssize_t sVar3;
  size_t __nbytes_00;
  size_t __nbytes_01;
  size_t __nbytes_02;
  size_t __nbytes_03;
  void *__buf_00;
  undefined4 in_register_00000034;
  int __fd_00;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int tmp;
  HorizontalAlignment local_24;
  
  local_24 = (HorizontalAlignment)((ulong)in_RAX >> 0x20);
  iVar1 = Util::readString((uint8_t *)CONCAT44(in_register_00000034,__fd),&this->text);
  puVar4 = (uint8_t *)CONCAT44(in_register_00000034,__fd) + iVar1;
  iVar1 = Util::readString(puVar4,&this->placeholder);
  puVar4 = puVar4 + iVar1;
  sVar3 = FontData::read((int)puVar4,&this->textFont,__nbytes_00);
  puVar5 = puVar4 + (int)sVar3;
  Color::read((int)puVar5,&this->textColor,__nbytes_01);
  iVar1 = Util::readInt32(puVar4 + (long)(int)sVar3 + 0x10,(int *)&local_24);
  puVar5 = puVar5 + (long)iVar1 + 0x10;
  this->horizontalAlignment = local_24;
  iVar1 = Util::readInt32(puVar5,(int *)&local_24);
  puVar5 = puVar5 + iVar1;
  this->verticalAlignment = local_24;
  iVar1 = Util::readInt32(puVar5,(int *)&local_24);
  puVar5 = puVar5 + iVar1;
  this->textTrimming = local_24;
  iVar1 = Util::readInt32(puVar5,(int *)&local_24);
  puVar5 = puVar5 + iVar1;
  this->lineBreak = local_24;
  iVar1 = Util::readInt32(puVar5,&this->textInputMode);
  puVar5 = puVar5 + iVar1;
  iVar1 = Util::readBool(puVar5,&this->passwordMode);
  puVar5 = puVar5 + iVar1;
  iVar1 = Util::readInt32(puVar5,&this->imeWindowMode);
  puVar5 = puVar5 + iVar1;
  iVar1 = Util::readString(puVar5,&this->imeWindowTitle);
  puVar5 = puVar5 + iVar1;
  iVar1 = Util::readInt32(puVar5,&this->imeEnterLabel);
  iVar2 = Util::readBool(puVar5 + iVar1,&this->acceptsReturn);
  iVar1 = (int)(puVar5 + iVar1);
  __fd_00 = iVar1 + iVar2;
  Color::read(__fd_00,&this->placeHolderColor,__nbytes_02);
  sVar3 = FontData::read(iVar2 + iVar1 + 0x10,&this->placeholderFont,__nbytes_03);
  sVar3 = Widget::read(&this->super_Widget,(int)sVar3 + __fd_00 + 0x10,__buf_00,__nbytes);
  return sVar3;
}

Assistant:

uint8_t* TextField::read(uint8_t* buf)
{
	buf += Util::readString(buf, text);
	buf += Util::readString(buf, placeholder);
	buf += FontData::read(buf, textFont);
	buf += Color::read(buf, textColor);

	int tmp;
	buf += Util::readInt32(buf, tmp);
	horizontalAlignment = static_cast<HorizontalAlignment>(tmp);
	buf += Util::readInt32(buf, tmp);
	verticalAlignment = static_cast<VerticalAlignment>(tmp);
	buf += Util::readInt32(buf, tmp);
	textTrimming = static_cast<TextTrimming>(tmp);
	buf += Util::readInt32(buf, tmp);
	lineBreak = static_cast<LineBreak>(tmp);
	buf += Util::readInt32(buf, textInputMode);
	buf += Util::readBool(buf, passwordMode);
	buf += Util::readInt32(buf, imeWindowMode);
	buf += Util::readString(buf, imeWindowTitle);
	buf += Util::readInt32(buf, imeEnterLabel);
	buf += Util::readBool(buf, acceptsReturn);
	buf += Color::read(buf, placeHolderColor);
	buf += FontData::read(buf, placeholderFont);

	return Widget::read(buf);
}